

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

size_t snappy::Compress(char *input,size_t input_length,string *compressed)

{
  string *input_length_00;
  size_t input_00;
  char *compressed_00;
  size_t local_28;
  size_t compressed_length;
  string *compressed_local;
  size_t input_length_local;
  char *input_local;
  
  compressed_length = (size_t)compressed;
  compressed_local = (string *)input_length;
  input_length_local = (size_t)input;
  MaxCompressedLength(input_length);
  std::__cxx11::string::resize((ulong)compressed);
  input_00 = input_length_local;
  input_length_00 = compressed_local;
  compressed_00 = string_as_array((string *)compressed_length);
  RawCompress((char *)input_00,(size_t)input_length_00,compressed_00,&local_28);
  std::__cxx11::string::resize(compressed_length);
  return local_28;
}

Assistant:

size_t Compress(const char* input, size_t input_length, string* compressed) {
  // Pre-grow the buffer to the max length of the compressed output
  compressed->resize(MaxCompressedLength(input_length));

  size_t compressed_length;
  RawCompress(input, input_length, string_as_array(compressed),
              &compressed_length);
  compressed->resize(compressed_length);
  return compressed_length;
}